

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BBoxRenderCase::BBoxRenderCase
          (BBoxRenderCase *this,Context *context,char *name,char *description,int numIterations,
          deUint32 flags)

{
  byte bVar1;
  BBoxSize BVar2;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,description);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BBoxRenderCase_00b3ab28;
  this->m_renderTarget = ~numIterations & RENDERTARGET_FBO;
  BVar2 = BBOXSIZE_SMALLER - ((numIterations & 0x10U) == 0);
  if ((numIterations & 4U) != 0) {
    BVar2 = BBOXSIZE_EQUAL;
  }
  this->m_bboxSize = BVar2;
  bVar1 = (byte)numIterations;
  this->m_hasTessellationStage = (bool)(bVar1 >> 5 & 1);
  this->m_hasGeometryStage = (bool)(bVar1 >> 6 & 1);
  this->m_useGlobalState = (bool)(bVar1 >> 7);
  this->m_calcPerPrimitiveBBox = (bool)((byte)((uint)numIterations >> 9) & 1);
  this->m_numIterations = 0xc;
  (this->m_program).super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
  m_data.ptr = (ShaderProgram *)0x0;
  (this->m_vbo).
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)0x0;
  (this->m_fbo).
  super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  .m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)3> *)0x0;
  (this->m_iterationConfigs).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterationConfigs).
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->m_iterationConfigs).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::BBoxRenderCase::IterationConfig>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  return;
}

Assistant:

BBoxRenderCase::BBoxRenderCase (Context& context, const char* name, const char* description, int numIterations, deUint32 flags)
	: TestCase					(context, name, description)
	, m_renderTarget			((flags & FLAG_RENDERTARGET_DEFAULT) ? (RENDERTARGET_DEFAULT) : (RENDERTARGET_FBO))
	, m_bboxSize				((flags & FLAG_BBOXSIZE_EQUAL) ? (BBOXSIZE_EQUAL) : (flags & FLAG_BBOXSIZE_SMALLER) ? (BBOXSIZE_SMALLER) : (BBOXSIZE_LARGER))
	, m_hasTessellationStage	((flags & FLAG_TESSELLATION) != 0)
	, m_hasGeometryStage		((flags & FLAG_GEOMETRY) != 0)
	, m_useGlobalState			((flags & FLAG_SET_BBOX_STATE) != 0)
	, m_calcPerPrimitiveBBox	((flags & FLAG_PER_PRIMITIVE_BBOX) != 0)
	, m_numIterations			(numIterations)
	, m_iteration				(0)
{
	// validate flags
	DE_ASSERT((((m_renderTarget == RENDERTARGET_DEFAULT)	?	(FLAG_RENDERTARGET_DEFAULT)	: (0)) |
			   ((m_renderTarget == RENDERTARGET_FBO)		?	(FLAG_RENDERTARGET_FBO)		: (0)) |
			   ((m_bboxSize == BBOXSIZE_EQUAL)				?	(FLAG_BBOXSIZE_EQUAL)		: (0)) |
			   ((m_bboxSize == BBOXSIZE_LARGER)				?	(FLAG_BBOXSIZE_LARGER)		: (0)) |
			   ((m_bboxSize == BBOXSIZE_SMALLER)			?	(FLAG_BBOXSIZE_SMALLER)		: (0)) |
			   ((m_hasTessellationStage)					?	(FLAG_TESSELLATION)			: (0)) |
			   ((m_hasGeometryStage)						?	(FLAG_GEOMETRY)				: (0)) |
			   ((m_useGlobalState)							?	(FLAG_SET_BBOX_STATE)		: (0)) |
			   ((!m_useGlobalState)							?	(FLAG_SET_BBOX_OUTPUT)		: (0)) |
			   ((m_calcPerPrimitiveBBox)					?	(FLAG_PER_PRIMITIVE_BBOX)	: (0))) == (flags & ((1u << FLAGBIT_USER_BIT) - 1)));

	DE_ASSERT(m_useGlobalState || m_hasTessellationStage); // using non-global state requires tessellation

	if (m_calcPerPrimitiveBBox)
	{
		DE_ASSERT(!m_useGlobalState); // per-primitive test requires per-primitive (non-global) state
		DE_ASSERT(m_bboxSize == BBOXSIZE_EQUAL); // smaller is hard to verify, larger not interesting
	}
}